

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void rand_pk(secp256k1_pubkey *pk)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  secp256k1_keypair *psVar4;
  secp256k1_keypair *keypair_00;
  size_t count;
  long lVar5;
  size_t len;
  void *ndata;
  size_t msglen;
  uchar *msg;
  secp256k1_keypair *keypair_01;
  secp256k1_context *psVar6;
  long *ptr;
  uchar *nonce32;
  int iVar7;
  secp256k1_keypair *xonly_pk32;
  secp256k1_keypair *psVar8;
  secp256k1_xonly_pubkey *pubkey;
  uchar *algo;
  secp256k1_keypair keypair;
  uchar seckey [32];
  secp256k1_xonly_pubkey sStackY_310;
  secp256k1_keypair *psStackY_2d0;
  uchar *puStackY_2c8;
  secp256k1_keypair *psStackY_2c0;
  code *pcStackY_2b8;
  secp256k1_schnorrsig_extraparams sStack_2a0;
  undefined1 auStack_280 [64];
  undefined1 auStack_240 [160];
  char acStack_1a0 [64];
  long *plStack_160;
  uchar auStack_138 [32];
  uchar auStack_118 [40];
  secp256k1_context *psStack_f0;
  secp256k1_context *psStack_d8;
  long alStack_d0 [5];
  secp256k1_pubkey *psStack_a8;
  code *pcStack_a0;
  secp256k1_keypair sStack_98;
  uchar local_38 [40];
  
  psVar4 = &sStack_98;
  pcStack_a0 = (code *)0x1685fa;
  secp256k1_testrand256(local_38);
  pcStack_a0 = (code *)0x16860c;
  psVar6 = CTX;
  iVar1 = secp256k1_keypair_create(CTX,&sStack_98,local_38);
  if (iVar1 == 0) {
    pcStack_a0 = (code *)0x168648;
    rand_pk_cold_2();
  }
  else if (pk != (secp256k1_pubkey *)0x0) {
    *(undefined8 *)(pk->data + 0x30) = sStack_98.data._80_8_;
    *(undefined8 *)(pk->data + 0x38) = sStack_98.data._88_8_;
    *(undefined8 *)(pk->data + 0x20) = sStack_98.data._64_8_;
    *(undefined8 *)(pk->data + 0x28) = sStack_98.data._72_8_;
    *(undefined8 *)(pk->data + 0x10) = sStack_98.data._48_8_;
    *(undefined8 *)(pk->data + 0x18) = sStack_98.data._56_8_;
    *(undefined8 *)pk->data = sStack_98.data._32_8_;
    *(undefined8 *)(pk->data + 8) = sStack_98.data._40_8_;
    return;
  }
  pcStack_a0 = test_sort_helper;
  rand_pk_cold_1();
  pcStack_a0 = (code *)local_38;
  psStack_a8 = pk;
  if (count == 0) {
    psStack_d8 = CTX;
    secp256k1_hsort(alStack_d0,0,8,secp256k1_pubkey_sort_cmp,&psStack_d8);
  }
  else {
    sVar2 = 0;
    do {
      alStack_d0[sVar2] =
           (long)((&(psVar6->ecmult_gen_ctx).blind)[*(long *)((long)psVar4 + sVar2 * 8) * 2 + -1].d
                 + 3);
      sVar2 = sVar2 + 1;
    } while (count != sVar2);
    psStack_d8 = CTX;
    ptr = alStack_d0;
    sVar2 = count;
    secp256k1_hsort(ptr,count,8,secp256k1_pubkey_sort_cmp,&psStack_d8);
    sVar3 = 0;
    do {
      lVar5 = 0;
      do {
        sVar2 = CONCAT71((int7)(sVar2 >> 8),*(char *)(alStack_d0[sVar3] + lVar5));
        if (*(char *)(alStack_d0[sVar3] + lVar5) !=
            *(char *)((long)(psVar6->ecmult_gen_ctx).blind.d + lVar5 + -8)) {
          test_sort_helper_cold_1();
          nonce32 = auStack_138;
          msg = (uchar *)*ptr;
          psVar4 = (secp256k1_keypair *)ptr[1];
          xonly_pk32 = (secp256k1_keypair *)ptr[2];
          algo = (uchar *)ptr[3];
          psStack_f0 = psVar6;
          iVar1 = nonce_function_bip340
                            (auStack_138,msg,0x20,(uchar *)psVar4,(uchar *)xonly_pk32,algo,0xd,
                             (void *)ptr[4]);
          if (iVar1 == 0) {
            nonce_function_bip340_bitflip_cold_3();
          }
          else {
            secp256k1_testrand_flip((uchar *)ptr[sVar2],len);
            nonce32 = auStack_118;
            msg = (uchar *)*ptr;
            psVar4 = (secp256k1_keypair *)ptr[1];
            xonly_pk32 = (secp256k1_keypair *)ptr[2];
            algo = (uchar *)ptr[3];
            lVar5 = 0x20;
            iVar1 = nonce_function_bip340
                              (nonce32,msg,0x20,(uchar *)psVar4,(uchar *)xonly_pk32,algo,0xd,
                               (void *)ptr[4]);
            if (iVar1 != 0) {
              do {
                if (auStack_138[lVar5 + -0x20] != auStack_138[lVar5]) {
                  return;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 != 0x40);
              nonce_function_bip340_bitflip_cold_1();
              return;
            }
          }
          nonce_function_bip340_bitflip_cold_2();
          sStack_2a0.magic[0] = 0xda;
          sStack_2a0.magic[1] = 'o';
          sStack_2a0.magic[2] = 0xb3;
          sStack_2a0.magic[3] = 0x8c;
          sStack_2a0._4_4_ = 0;
          sStack_2a0.noncefp = (secp256k1_nonce_function_hardened)0x0;
          keypair_01 = (secp256k1_keypair *)(auStack_240 + 0x40);
          pcStackY_2b8 = (code *)0x1687ec;
          keypair_00 = psVar4;
          psVar6 = CTX;
          psVar8 = xonly_pk32;
          plStack_160 = ptr;
          iVar1 = secp256k1_keypair_create(CTX,keypair_01,nonce32);
          iVar7 = (int)psVar8;
          if (iVar1 == 0) {
            pcStackY_2b8 = (code *)0x168926;
            test_schnorrsig_bip_vectors_check_signing_cold_9();
          }
          else {
            keypair_01 = (secp256k1_keypair *)auStack_280;
            psVar8 = (secp256k1_keypair *)(auStack_240 + 0x40);
            pcStackY_2b8 = (code *)0x168818;
            keypair_00 = xonly_pk32;
            psVar6 = CTX;
            iVar1 = secp256k1_schnorrsig_sign_custom
                              (CTX,(uchar *)keypair_01,psVar4->data,(size_t)xonly_pk32,psVar8,
                               &sStack_2a0);
            iVar7 = (int)psVar8;
            if (iVar1 != 0) {
              lVar5 = 0;
              goto LAB_00168822;
            }
          }
          pcStackY_2b8 = (code *)0x16892b;
          test_schnorrsig_bip_vectors_check_signing_cold_8();
          goto LAB_0016892b;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      sVar3 = sVar3 + 1;
      psVar6 = (secp256k1_context *)((psVar6->ecmult_gen_ctx).initial.x.n + 3);
    } while (sVar3 != count);
  }
  return;
  while (lVar5 = lVar5 + 1, lVar5 != 0x40) {
LAB_00168822:
    keypair_00 = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair_00 >> 8),auStack_280[lVar5]);
    if (auStack_280[lVar5] != algo[lVar5]) goto LAB_0016893f;
  }
  if (xonly_pk32 == (secp256k1_keypair *)0x20) {
    keypair_01 = (secp256k1_keypair *)auStack_280;
    auStack_280[0x30] = '\0';
    auStack_280[0x31] = '\0';
    auStack_280[0x32] = '\0';
    auStack_280[0x33] = '\0';
    auStack_280[0x34] = '\0';
    auStack_280[0x35] = '\0';
    auStack_280[0x36] = '\0';
    auStack_280[0x37] = '\0';
    auStack_280[0x38] = '\0';
    auStack_280[0x39] = '\0';
    auStack_280[0x3a] = '\0';
    auStack_280[0x3b] = '\0';
    auStack_280[0x3c] = '\0';
    auStack_280[0x3d] = '\0';
    auStack_280[0x3e] = '\0';
    auStack_280[0x3f] = '\0';
    auStack_280[0x20] = '\0';
    auStack_280[0x21] = '\0';
    auStack_280[0x22] = '\0';
    auStack_280[0x23] = '\0';
    auStack_280[0x24] = '\0';
    auStack_280[0x25] = '\0';
    auStack_280[0x26] = '\0';
    auStack_280[0x27] = '\0';
    auStack_280[0x28] = '\0';
    auStack_280[0x29] = '\0';
    auStack_280[0x2a] = '\0';
    auStack_280[0x2b] = '\0';
    auStack_280[0x2c] = '\0';
    auStack_280[0x2d] = '\0';
    auStack_280[0x2e] = '\0';
    auStack_280[0x2f] = '\0';
    auStack_280[0x10] = '\0';
    auStack_280[0x11] = '\0';
    auStack_280[0x12] = '\0';
    auStack_280[0x13] = '\0';
    auStack_280[0x14] = '\0';
    auStack_280[0x15] = '\0';
    auStack_280[0x16] = '\0';
    auStack_280[0x17] = '\0';
    auStack_280[0x18] = '\0';
    auStack_280[0x19] = '\0';
    auStack_280[0x1a] = '\0';
    auStack_280[0x1b] = '\0';
    auStack_280[0x1c] = '\0';
    auStack_280[0x1d] = '\0';
    auStack_280[0x1e] = '\0';
    auStack_280[0x1f] = '\0';
    auStack_280[0] = '\0';
    auStack_280[1] = '\0';
    auStack_280[2] = '\0';
    auStack_280[3] = '\0';
    auStack_280[4] = '\0';
    auStack_280[5] = '\0';
    auStack_280[6] = '\0';
    auStack_280[7] = '\0';
    auStack_280[8] = '\0';
    auStack_280[9] = '\0';
    auStack_280[10] = '\0';
    auStack_280[0xb] = '\0';
    auStack_280[0xc] = '\0';
    auStack_280[0xd] = '\0';
    auStack_280[0xe] = '\0';
    auStack_280[0xf] = '\0';
    psVar8 = (secp256k1_keypair *)(auStack_240 + 0x40);
    keypair_00 = (secp256k1_keypair *)0x20;
    pcStackY_2b8 = (code *)0x16887d;
    psVar6 = CTX;
    iVar1 = secp256k1_schnorrsig_sign_internal
                      (CTX,(uchar *)keypair_01,psVar4->data,0x20,psVar8,nonce_function_bip340,ndata)
    ;
    iVar7 = (int)psVar8;
    if (iVar1 == 0) goto LAB_0016893a;
    lVar5 = 0;
    do {
      keypair_00 = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair_00 >> 8),auStack_280[lVar5]);
      if (auStack_280[lVar5] != algo[lVar5]) goto LAB_00168949;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
  }
  keypair_01 = (secp256k1_keypair *)acStack_1a0;
  pcStackY_2b8 = (code *)0x1688b5;
  psVar6 = CTX;
  iVar1 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)keypair_01,msg);
  if (iVar1 == 0) {
LAB_0016892b:
    pcStackY_2b8 = (code *)0x168930;
    test_schnorrsig_bip_vectors_check_signing_cold_6();
LAB_00168930:
    pcStackY_2b8 = (code *)0x168935;
    test_schnorrsig_bip_vectors_check_signing_cold_5();
  }
  else {
    keypair_01 = (secp256k1_keypair *)auStack_240;
    keypair_00 = (secp256k1_keypair *)(auStack_240 + 0x40);
    pcStackY_2b8 = (code *)0x1688d4;
    psVar6 = CTX;
    iVar1 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)keypair_01,(int *)0x0,keypair_00);
    if (iVar1 == 0) goto LAB_00168930;
    lVar5 = 0;
    do {
      keypair_00 = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair_00 >> 8),auStack_240[lVar5]);
      if (auStack_240[lVar5] != acStack_1a0[lVar5]) goto LAB_00168944;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
    keypair_01 = (secp256k1_keypair *)auStack_280;
    pubkey = (secp256k1_xonly_pubkey *)auStack_240;
    pcStackY_2b8 = (code *)0x16890c;
    keypair_00 = xonly_pk32;
    psVar6 = CTX;
    iVar1 = secp256k1_schnorrsig_verify
                      (CTX,(uchar *)keypair_01,psVar4->data,(size_t)xonly_pk32,pubkey);
    iVar7 = (int)pubkey;
    if (iVar1 != 0) {
      return;
    }
  }
  pcStackY_2b8 = (code *)0x16893a;
  test_schnorrsig_bip_vectors_check_signing_cold_4();
LAB_0016893a:
  pcStackY_2b8 = (code *)0x16893f;
  test_schnorrsig_bip_vectors_check_signing_cold_7();
LAB_0016893f:
  pcStackY_2b8 = (code *)0x168944;
  test_schnorrsig_bip_vectors_check_signing_cold_1();
LAB_00168944:
  pcStackY_2b8 = (code *)0x168949;
  test_schnorrsig_bip_vectors_check_signing_cold_3();
LAB_00168949:
  pcStackY_2b8 = test_schnorrsig_bip_vectors_check_verify;
  test_schnorrsig_bip_vectors_check_signing_cold_2();
  psStackY_2d0 = xonly_pk32;
  puStackY_2c8 = algo;
  psStackY_2c0 = psVar4;
  pcStackY_2b8 = (code *)msg;
  iVar1 = secp256k1_xonly_pubkey_parse(CTX,&sStackY_310,(uchar *)psVar6);
  if (iVar1 == 0) {
    test_schnorrsig_bip_vectors_check_verify_cold_2();
  }
  else {
    iVar1 = secp256k1_schnorrsig_verify(CTX,keypair_00->data,keypair_01->data,msglen,&sStackY_310);
    if (iVar1 == iVar7) {
      return;
    }
  }
  test_schnorrsig_bip_vectors_check_verify_cold_1();
  return;
}

Assistant:

static void rand_pk(secp256k1_pubkey *pk) {
    unsigned char seckey[32];
    secp256k1_keypair keypair;
    secp256k1_testrand256(seckey);
    CHECK(secp256k1_keypair_create(CTX, &keypair, seckey) == 1);
    CHECK(secp256k1_keypair_pub(CTX, pk, &keypair) == 1);
}